

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O1

int nni_ctx_setopt(nni_ctx *ctx,char *opt,void *v,size_t sz,nni_type t)

{
  nni_option *pnVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  nni_mtx *mtx;
  nng_duration *dp;
  
  mtx = &ctx->c_sock->s_mx;
  nni_mtx_lock(mtx);
  iVar2 = strcmp(opt,"recv-timeout");
  if (iVar2 == 0) {
    dp = &ctx->c_rcvtimeo;
  }
  else {
    iVar2 = strcmp(opt,"send-timeout");
    if (iVar2 != 0) {
      pnVar1 = (ctx->c_ops).ctx_options;
      iVar2 = 9;
      if (pnVar1 != (nni_option *)0x0) {
        __s2 = pnVar1->o_name;
        while (__s2 != (char *)0x0) {
          iVar3 = strcmp(opt,__s2);
          if (iVar3 == 0) {
            if (pnVar1->o_set == (_func_int_void_ptr_void_ptr_size_t_nni_type *)0x0) {
              iVar2 = 0x18;
            }
            else {
              iVar2 = (*pnVar1->o_set)(ctx->c_data,v,sz,t);
            }
            break;
          }
          __s2 = pnVar1[1].o_name;
          pnVar1 = pnVar1 + 1;
        }
      }
      goto LAB_00116f16;
    }
    dp = &ctx->c_sndtimeo;
  }
  iVar2 = nni_copyin_ms(dp,v,sz,t);
LAB_00116f16:
  nni_mtx_unlock(mtx);
  return iVar2;
}

Assistant:

int
nni_ctx_setopt(
    nni_ctx *ctx, const char *opt, const void *v, size_t sz, nni_type t)
{
	nni_sock   *sock = ctx->c_sock;
	nni_option *o;
	int         rv = NNG_ENOTSUP;

	nni_mtx_lock(&sock->s_mx);
	if (strcmp(opt, NNG_OPT_RECVTIMEO) == 0) {
		rv = nni_copyin_ms(&ctx->c_rcvtimeo, v, sz, t);
	} else if (strcmp(opt, NNG_OPT_SENDTIMEO) == 0) {
		rv = nni_copyin_ms(&ctx->c_sndtimeo, v, sz, t);
	} else if (ctx->c_ops.ctx_options != NULL) {
		for (o = ctx->c_ops.ctx_options; o->o_name != NULL; o++) {
			if (strcmp(opt, o->o_name) != 0) {
				continue;
			}
			if (o->o_set == NULL) {
				rv = NNG_EREADONLY;
				break;
			}
			rv = o->o_set(ctx->c_data, v, sz, t);
			break;
		}
	}

	nni_mtx_unlock(&sock->s_mx);
	return (rv);
}